

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::WriteBufferResetsWatchdog(AmpIO *this)

{
  uint32_t uVar1;
  bool local_11;
  bool ret;
  AmpIO *this_local;
  
  local_11 = true;
  uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar1 < 8) {
    local_11 = (((this->WriteBuffer[this->WB_CURR_OFFSET] & 0x80000000) != 0 ||
                (this->WriteBuffer[this->WB_CURR_OFFSET + 1] & 0x80000000) != 0) ||
               (this->WriteBuffer[this->WB_CURR_OFFSET + 2] & 0x80000000) != 0) ||
               (this->WriteBuffer[this->WB_CURR_OFFSET + 3] & 0x80000000) != 0;
  }
  return local_11;
}

Assistant:

bool AmpIO::WriteBufferResetsWatchdog(void) const
{
    bool ret = true;
    if (GetFirmwareVersion() < 8) {
        // For Firmware versions prior to Rev 7, we must check whether any DAC valid bit
        // is set. For now, we also perform this check for Firmware Rev 7, but it could
        // be removed. Starting with Firmware Rev 7, the power control quadlet is always
        // written, so the watchdog is always reset.
        ret = (WriteBuffer[WB_CURR_OFFSET + 0] & VALID_BIT)
            | (WriteBuffer[WB_CURR_OFFSET + 1] & VALID_BIT)
            | (WriteBuffer[WB_CURR_OFFSET + 2] & VALID_BIT)
            | (WriteBuffer[WB_CURR_OFFSET + 3] & VALID_BIT);
    }
    return ret;
}